

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void __thiscall
CUI::DoEditBoxOption(CUI *this,CLineInput *pLineInput,CUIRect *pRect,char *pStr,float VSplitVal)

{
  long in_FS_OFFSET;
  float FontSize;
  CUIRect EditBox;
  CUIRect Label;
  char aBuf [32];
  CUIRect local_78;
  CUIRect local_68;
  vec4 local_58 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0].field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
  local_58[0].field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
  local_58[0].field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
  local_58[0].field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3e800000;
  CUIRect::Draw(pRect,local_58,5.0,0xf);
  CUIRect::VSplitLeft(pRect,VSplitVal,&local_68,&local_78);
  FontSize = pRect->h * 0.8 * 0.8;
  str_format((char *)local_58,0x20,"%s:",pStr);
  DoLabel(this,&local_68,(char *)local_58,FontSize,5,-1.0,true);
  DoEditBox(this,pLineInput,&local_78,FontSize,0xf,
            &DarkButtonColorFunction.super_IButtonColorFunction);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUI::DoEditBoxOption(CLineInput *pLineInput, const CUIRect *pRect, const char *pStr, float VSplitVal)
{
	pRect->Draw(vec4(0.0f, 0.0f, 0.0f, 0.25f));

	CUIRect Label, EditBox;
	pRect->VSplitLeft(VSplitVal, &Label, &EditBox);

	const float FontSize = pRect->h*CUI::ms_FontmodHeight*0.8f;
	char aBuf[32];
	str_format(aBuf, sizeof(aBuf), "%s:", pStr);
	DoLabel(&Label, aBuf, FontSize, TEXTALIGN_MC);

	DoEditBox(pLineInput, &EditBox, FontSize);
}